

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregator.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_acc47::MinKernel::aggregate
          (MinKernel *this,CaliperMetadataAccessInterface *db,EntryList *list)

{
  pointer pEVar1;
  Node *pNVar2;
  int iVar3;
  Node *pNVar4;
  Attribute AVar5;
  cali_id_t cVar6;
  cali_id_t cVar7;
  Entry *e;
  Config *this_00;
  pointer pEVar8;
  Variant local_48;
  undefined4 extraout_var;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  this_00 = this->m_config;
  pNVar4 = (this_00->m_target_attr).m_node;
  if (pNVar4 == (Node *)0x0) {
    iVar3 = (*db->_vptr_CaliperMetadataAccessInterface[2])(db,&this_00->m_target_attr_name);
    pNVar4 = (Node *)CONCAT44(extraout_var,iVar3);
    (this_00->m_target_attr).m_node = pNVar4;
    this_00 = this->m_config;
  }
  AVar5 = Config::get_min_attr(this_00,db);
  if (AVar5.m_node != (Node *)0x0) {
    pEVar8 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pEVar1 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pEVar8 != pEVar1) {
      do {
        pNVar2 = pEVar8->m_node;
        cVar6 = 0xffffffffffffffff;
        cVar7 = 0xffffffffffffffff;
        if ((pNVar2 != (Node *)0x0) && (cVar7 = pNVar2->m_attribute, cVar7 == 8)) {
          cVar7 = pNVar2->m_id;
        }
        if (pNVar4 != (Node *)0x0) {
          cVar6 = pNVar4->m_id;
        }
        if (cVar7 == cVar6) {
LAB_00196033:
          local_48.m_v.type_and_size = (pEVar8->m_value).m_v.type_and_size;
          local_48.m_v.value = (pEVar8->m_value).m_v.value;
          cali::Variant::min(&this->m_min,&local_48);
        }
        else {
          if (pNVar2 == (Node *)0x0) {
            cVar7 = 0xffffffffffffffff;
          }
          else {
            cVar7 = pNVar2->m_attribute;
            if (cVar7 == 8) {
              cVar7 = pNVar2->m_id;
            }
          }
          if (cVar7 == (AVar5.m_node)->m_id) goto LAB_00196033;
        }
        pEVar8 = pEVar8 + 1;
      } while (pEVar8 != pEVar1);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return;
}

Assistant:

virtual void aggregate(CaliperMetadataAccessInterface& db, const EntryList& list)
    {
        std::lock_guard<std::mutex> g(m_lock);

        Attribute target_attr = m_config->get_target_attr(db);
        Attribute min_attr    = m_config->get_min_attr(db);

        if (!min_attr)
            return;

        for (const Entry& e : list) {
            if (e.attribute() == target_attr.id() || e.attribute() == min_attr.id())
                m_min.min(e.value());
        }
    }